

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxBoundFlippingRT<double>::selectEnter
          (SPxBoundFlippingRT<double> *this,double *val,int leaveIdx,bool polish)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  SPxSolverBase<double> *pSVar4;
  UpdateVector<double> *pUVar5;
  double *vec;
  double *upd;
  double *low;
  double *upp;
  pointer pBVar6;
  pointer pBVar7;
  Item *pIVar8;
  element_type *peVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar10;
  BreakpointSource BVar11;
  BreakpointSource BVar12;
  int iVar13;
  uint uVar14;
  SPxId SVar15;
  pointer pdVar16;
  DataKey DVar17;
  double *pdVar18;
  undefined8 uVar19;
  int iVar22;
  pointer pdVar23;
  long lVar24;
  Nonzero<double> *pNVar25;
  UpdateVector<double> *pUVar26;
  double *upd_00;
  double *vec_00;
  double *pdVar27;
  ulong uVar28;
  ulong uVar29;
  bool bVar30;
  ulong uVar31;
  undefined4 uVar32;
  undefined4 uVar33;
  double dVar34;
  double dVar35;
  int *piVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double *low_00;
  double *low_01;
  double *upp_00;
  double *upp_01;
  uint local_ec;
  double local_e8;
  int nBp;
  int minIdx;
  int *local_d8;
  undefined8 uStack_d0;
  double *local_c0;
  double local_b8;
  SPxId enterId;
  BreakpointCompare compare;
  double local_68;
  Breakpoint tmp;
  undefined8 uVar20;
  undefined8 uVar21;
  
  pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  if ((pSVar4->leaveCount * -0x3d70a3d7 + 0x51eb850U >> 2 | pSVar4->leaveCount * 0x40000000) <
      0x28f5c29) {
    this->flipPotential = 1.0;
  }
  if ((((this->super_SPxFastRT<double>).field_0x51 != '\x01' || polish) || (pSVar4->theRep == ROW))
     || (this->flipPotential <= 0.0)) {
    SVar15 = SPxFastRT<double>::selectEnter(&this->super_SPxFastRT<double>,val,leaveIdx,polish);
    return (SPxId)SVar15.super_DataKey;
  }
  pUVar26 = pSVar4->theCoPvec;
  pUVar5 = pSVar4->thePvec;
  pdVar27 = (pUVar5->super_VectorBase<double>).val.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start;
  upd_00 = (pUVar5->thedelta).super_VectorBase<double>.val.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  piVar36 = (pUVar5->thedelta).super_IdxSet.idx;
  iVar13 = (pUVar5->thedelta).super_IdxSet.num;
  low_01 = (pSVar4->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  upp_01 = (pSVar4->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  vec = (pUVar26->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start;
  upd = (pUVar26->thedelta).super_VectorBase<double>.val.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
  ;
  local_d8 = (pUVar26->thedelta).super_IdxSet.idx;
  local_e8 = (double)CONCAT44(local_e8._4_4_,(pUVar26->thedelta).super_IdxSet.num);
  low = (pSVar4->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  upp = (pSVar4->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_b8 = *val;
  *val = 0.0;
  nBp = 0;
  minIdx = -1;
  local_c0 = val;
  if (local_b8 <= 0.0) {
    collectBreakpointsMin(this,&nBp,&minIdx,piVar36,iVar13,upd_00,pdVar27,upp_01,low_01,PVEC);
    collectBreakpointsMin(this,&nBp,&minIdx,local_d8,local_e8._0_4_,upd,vec,upp,low,COPVEC);
  }
  else {
    collectBreakpointsMax(this,&nBp,&minIdx,piVar36,iVar13,upd_00,pdVar27,upp_01,low_01,PVEC);
    collectBreakpointsMax(this,&nBp,&minIdx,local_d8,local_e8._0_4_,upd,vec,upp,low,COPVEC);
  }
  if (nBp == 0) {
    *local_c0 = local_b8;
    uVar19._0_4_ = enterId.super_DataKey.info;
    uVar19._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar19;
  }
  pBVar6 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar7 = pBVar6 + minIdx;
  dVar35 = pBVar7->val;
  iVar2 = pBVar7->idx;
  BVar12 = pBVar7->src;
  iVar13 = pBVar6->idx;
  BVar11 = pBVar6->src;
  pBVar7 = pBVar6 + minIdx;
  pBVar7->val = pBVar6->val;
  pBVar7->idx = iVar13;
  pBVar7->src = BVar11;
  pBVar7 = (this->breakpoints).data.
           super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pBVar7->val = dVar35;
  pBVar7->idx = iVar2;
  pBVar7->src = BVar12;
  pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
  dVar35 = (pSVar4->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[leaveIdx];
  dVar34 = 0.0;
  if ((dVar35 == 0.0) && (!NAN(dVar35))) {
    dVar35 = pSVar4->instableLeaveVal;
  }
  piVar36 = (int *)ABS(dVar35);
  compare.entry =
       (this->breakpoints).data.
       super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_ec = 0;
  bVar30 = 0 < nBp;
  iVar13 = 0;
  uVar14 = 0xffffffff;
  if ((0 < nBp) && (iVar13 = 0, 0.0 < (double)piVar36)) {
    iVar13 = 0;
    uStack_d0 = 0;
    do {
      local_e8 = dVar34;
      local_d8 = piVar36;
      if (iVar13 < (int)local_ec) {
        iVar13 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                           ((this->breakpoints).data.
                            super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                            ._M_impl.super__Vector_impl_data._M_start,&compare,iVar13 + 1,nBp,4,0,0,
                            true);
      }
      lVar24 = (long)(int)local_ec;
      pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
      pBVar7 = (this->breakpoints).data.
               super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar2 = pBVar7[lVar24].idx;
      if (pBVar7[lVar24].src == PVEC) {
        if (pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.stat)->data[iVar2] < 1) {
          uVar32 = SUB84(ABS(upd_00[iVar2]),0);
          uVar33 = (undefined4)((ulong)ABS(upd_00[iVar2]) >> 0x20);
          pdVar23 = (pSVar4->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar16 = (pSVar4->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          goto LAB_0023ad7f;
        }
        pBVar7[lVar24].idx = -1;
        pUVar26 = pSVar4->thePvec;
LAB_0023ad2d:
        SSVectorBase<double>::clearIdx(&pUVar26->thedelta,iVar2);
        dVar34 = local_e8;
        piVar36 = local_d8;
      }
      else {
        if (0 < pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.costat)->data[iVar2])
        {
          pBVar7[lVar24].idx = -1;
          pUVar26 = pSVar4->theCoPvec;
          goto LAB_0023ad2d;
        }
        uVar32 = SUB84(ABS(upd[iVar2]),0);
        uVar33 = (undefined4)((ulong)ABS(upd[iVar2]) >> 0x20);
        pdVar23 = (pSVar4->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar16 = (pSVar4->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
LAB_0023ad7f:
        piVar36 = (int *)((double)local_d8 -
                         (pdVar16[iVar2] * (double)CONCAT44(uVar33,uVar32) -
                         pdVar23[iVar2] * (double)CONCAT44(uVar33,uVar32)));
        if ((double)CONCAT44(uVar33,uVar32) <= local_e8) {
          uVar32 = SUB84(local_e8,0);
          uVar33 = (undefined4)((ulong)local_e8 >> 0x20);
        }
        dVar34 = (double)CONCAT44(uVar33,uVar32);
      }
      uVar1 = local_ec + 1;
      bVar30 = (int)uVar1 < nBp;
      uVar14 = local_ec;
    } while (((int)uVar1 < nBp) && (local_ec = uVar1, 0.0 < (double)piVar36));
  }
  local_ec = uVar14;
  if ((!bVar30) &&
     (pdVar18 = &(this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta,
     *pdVar18 <= (double)piVar36 && (double)piVar36 != *pdVar18)) {
    this->flipPotential = this->flipPotential + -0.5;
    *local_c0 = local_b8;
    DVar17 = (DataKey)SPxFastRT<double>::selectEnter
                                (&this->super_SPxFastRT<double>,local_c0,leaveIdx,false);
    uVar21._0_4_ = DVar17.info;
    uVar21._4_4_ = DVar17.idx;
    return (SPxId)uVar21;
  }
  local_d8 = (int *)(this->breakpoints).data.
                    super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start[(int)uVar14].val;
  uVar28 = 0xffffffff;
  uVar31 = (long)(int)uVar14;
  local_e8 = dVar34;
  do {
    uVar14 = (uint)uVar28;
    uVar29 = uVar31 + 1;
    if ((long)nBp <= (long)uVar29) break;
    if ((long)iVar13 <= (long)uVar31) {
      iVar13 = SPxQuicksortPart<soplex::SPxBoundFlippingRT<double>::Breakpoint,soplex::SPxBoundFlippingRT<double>::BreakpointCompare>
                         ((this->breakpoints).data.
                          super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                          ._M_impl.super__Vector_impl_data._M_start,&compare,iVar13 + 1,nBp,4,0,0,
                          true);
    }
    pSVar4 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver;
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    iVar2 = pBVar7[uVar29].idx;
    if (pBVar7[uVar29].src == PVEC) {
      if (pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.stat)->data[iVar2] < 1) {
        dVar35 = upd_00[iVar2];
        dVar34 = ABS(dVar35);
        dVar38 = 0.0;
        dVar37 = 0.0;
        if (local_e8 < dVar34) {
          pIVar8 = (pSVar4->thevectors->set).theitem;
          iVar3 = (pSVar4->thevectors->set).thekey[iVar2].idx;
          iVar22 = pIVar8[iVar3].data.super_SVectorBase<double>.memused;
          if (0 < iVar22) {
            pNVar25 = pIVar8[iVar3].data.super_SVectorBase<double>.m_elem;
            iVar22 = iVar22 + 1;
            dVar39 = 0.0;
            do {
              dVar40 = pNVar25->val *
                       (pSVar4->theCoPvec->super_VectorBase<double>).val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[pNVar25->idx];
              dVar37 = dVar38 + dVar40;
              dVar39 = dVar39 + (dVar40 - (dVar37 - dVar38)) +
                                (dVar38 - (dVar37 - (dVar37 - dVar38)));
              pNVar25 = pNVar25 + 1;
              iVar22 = iVar22 + -1;
              dVar38 = dVar37;
            } while (1 < iVar22);
            dVar37 = dVar37 + dVar39;
          }
          pdVar18 = low_01;
          if (0.0 < dVar35) {
            pdVar18 = upp_01;
          }
          (pSVar4->thePvec->super_VectorBase<double>).val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar2] = dVar37;
          dVar38 = pdVar18[iVar2];
          pdVar18 = pdVar27;
          goto LAB_0023b032;
        }
        goto LAB_0023b056;
      }
      pBVar7[uVar29].idx = -1;
      pUVar26 = pSVar4->thePvec;
LAB_0023af02:
      SSVectorBase<double>::clearIdx(&pUVar26->thedelta,iVar2);
      bVar30 = false;
    }
    else {
      if (0 < pSVar4->theRep * ((pSVar4->super_SPxBasisBase<double>).thedesc.costat)->data[iVar2]) {
        pBVar7[uVar29].idx = -1;
        pUVar26 = pSVar4->theCoPvec;
        goto LAB_0023af02;
      }
      dVar35 = upd[iVar2];
      dVar34 = ABS(dVar35);
      dVar38 = 0.0;
      if (local_e8 < dVar34) {
        pdVar18 = low;
        if (0.0 < dVar35) {
          pdVar18 = upp;
        }
        dVar38 = pdVar18[iVar2];
        pdVar18 = vec;
LAB_0023b032:
        dVar38 = (dVar38 - pdVar18[iVar2]) / dVar35;
        if (dVar38 <= (double)local_d8) {
          uVar28 = uVar29 & 0xffffffff;
          local_e8 = dVar34;
        }
      }
LAB_0023b056:
      bVar30 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>.delta + (double)local_d8
               < dVar38;
    }
    uVar14 = (uint)uVar28;
    uVar31 = uVar29;
  } while (!bVar30);
  local_d8 = (int *)(this->super_SPxFastRT<double>).fastDelta;
  peVar9 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  bVar30 = ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->instableLeave;
  this_00 = (this->super_SPxFastRT<double>).super_SPxRatioTester<double>._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar35 = peVar9->s_epsilon_multiplier;
  uVar31 = -(ulong)(dVar35 == 1.0);
  local_68 = (double)(~uVar31 & (ulong)(dVar35 * 1e-10) | uVar31 & 0x3ddb7cdfd9d7bdbb);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (bVar30 == false) {
    dVar35 = (this->super_SPxFastRT<double>).minStab;
    local_68 = (double)(-(ulong)(local_e8 < 1000.0) & (ulong)dVar35 |
                       ~-(ulong)(local_e8 < 1000.0) & (ulong)((local_e8 * dVar35) / 1000.0));
  }
  local_d8 = (int *)((double)local_d8 / local_e8);
  if ((int)uVar14 < 0) {
    bVar30 = false;
    uVar14 = local_ec;
    if (-1 < (int)local_ec) {
      do {
        pBVar7 = (this->breakpoints).data.
                 super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar13 = pBVar7[local_ec].idx;
        if (-1 < iVar13) {
          bVar30 = pBVar7[local_ec].src != PVEC;
          pdVar18 = upd_00;
          vec_00 = pdVar27;
          low_00 = low_01;
          upp_00 = upp_01;
          if (bVar30) {
            pdVar18 = upd;
            vec_00 = vec;
            low_00 = low;
            upp_00 = upp;
          }
          bVar30 = getData(this,local_c0,&enterId,iVar13,local_68,(double)local_d8,pdVar18,vec_00,
                           low_00,upp_00,(uint)bVar30,local_b8);
        }
        uVar14 = local_ec - 1;
      } while ((bVar30 == false) && (bVar10 = 0 < (int)local_ec, local_ec = uVar14, bVar10));
    }
    local_ec = uVar14 + 1;
  }
  else {
    if (local_e8 <= local_68) goto LAB_0023b33a;
    pBVar7 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    bVar30 = pBVar7[uVar14].src != PVEC;
    if (bVar30) {
      upd_00 = upd;
      pdVar27 = vec;
      low_01 = low;
      upp_01 = upp;
    }
    bVar30 = getData(this,local_c0,&enterId,pBVar7[uVar14].idx,local_68,(double)local_d8,upd_00,
                     pdVar27,low_01,upp_01,(uint)bVar30,local_b8);
  }
  if (bVar30 != false) {
    this->relax_count = 0;
    SPxFastRT<double>::tighten(&this->super_SPxFastRT<double>);
    if (((long)(int)local_ec < 1) ||
       (dVar35 = ABS((this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_start[(int)local_ec].val),
       pdVar27 = &(this->super_SPxFastRT<double>).fastDelta, dVar35 < *pdVar27 || dVar35 == *pdVar27
       )) {
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips = 0;
      dVar35 = this->flipPotential + -0.1;
    }
    else {
      flipAndUpdate(this,(int *)&local_ec);
      ((this->super_SPxFastRT<double>).super_SPxRatioTester<double>.thesolver)->boundflips =
           local_ec;
      if ((int)local_ec < 10) {
        dVar35 = this->flipPotential + -0.05;
      }
      else {
        dVar35 = 1.0;
      }
    }
    this->flipPotential = dVar35;
    uVar20._0_4_ = enterId.super_DataKey.info;
    uVar20._4_4_ = enterId.super_DataKey.idx;
    return (SPxId)uVar20;
  }
LAB_0023b33a:
  if (this->relax_count < 2) {
    SPxFastRT<double>::relax(&this->super_SPxFastRT<double>);
    this->relax_count = this->relax_count + 1;
    *local_c0 = local_b8;
    enterId = selectEnter(this,local_c0,leaveIdx,false);
  }
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxBoundFlippingRT<R>::selectEnter(
   R&                 val,
   int                   leaveIdx,
   bool                  polish
)
{
   assert(this->m_type == SPxSolverBase<R>::LEAVE);
   assert(this->thesolver->boundflips == 0);

   // reset the history and try again to do some long steps
   if(this->thesolver->leaveCount % SOPLEX_LONGSTEP_FREQ == 0)
   {
      SPxOut::debug(this, "DLBFRT06 resetting long step history\n");
      flipPotential = 1;
   }

   if(!enableBoundFlips || polish || this->thesolver->rep() == SPxSolverBase<R>::ROW
         || flipPotential <= 0)
   {
      SPxOut::debug(this, "DLBFRT07 switching to fast ratio test\n");
      return SPxFastRT<R>::selectEnter(val, leaveIdx, polish);
   }

   const R*  pvec = this->thesolver->pVec().get_const_ptr();
   const R*  pupd = this->thesolver->pVec().delta().values();
   const int*   pidx = this->thesolver->pVec().delta().indexMem();
   int          pupdnnz = this->thesolver->pVec().delta().size();
   const R*  lpb  = this->thesolver->lpBound().get_const_ptr();
   const R*  upb  = this->thesolver->upBound().get_const_ptr();

   const R*  cvec = this->thesolver->coPvec().get_const_ptr();
   const R*  cupd = this->thesolver->coPvec().delta().values();
   const int*   cidx = this->thesolver->coPvec().delta().indexMem();
   int          cupdnnz = this->thesolver->coPvec().delta().size();
   const R*  lcb  = this->thesolver->lcBound().get_const_ptr();
   const R*  ucb  = this->thesolver->ucBound().get_const_ptr();

   R max;

   // index in breakpoint array of minimal value (i.e. choice of normal RT)
   int minIdx;

   // temporary breakpoint data structure to make swaps possible
   Breakpoint tmp;

   // most stable pivot value in candidate set
   R moststable;

   // initialize invalid enterId
   SPxId enterId;

   // slope of objective function improvement
   R slope;

   // number of found breakpoints
   int nBp;

   // number of passed breakpoints
   int npassedBp;

   R degeneps;
   R stab;
   bool instable;

   max = val;
   val = 0.0;
   moststable = 0.0;
   nBp = 0;
   minIdx = -1;

   // get breakpoints and and determine the index of the minimal value
   if(max > 0)
   {
      collectBreakpointsMax(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMax(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }
   else
   {
      collectBreakpointsMin(nBp, minIdx, pidx, pupdnnz, pupd, pvec, upb, lpb, PVEC);
      // coverity[negative_returns]
      collectBreakpointsMin(nBp, minIdx, cidx, cupdnnz, cupd, cvec, ucb, lcb, COPVEC);
   }

   if(nBp == 0)
   {
      val = max;
      return enterId;
   }

   assert(minIdx >= 0);

   // swap smallest breakpoint to the front to skip the sorting phase if no bound flip is possible
   tmp = breakpoints[minIdx];
   breakpoints[minIdx] = breakpoints[0];
   breakpoints[0] = tmp;

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < breakpoints.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(breakpoints[i].val));
         // the breakpoint formulas should not produce inf values
         assert(!isinf(breakpoints[i].val));
      }
   }

#endif

   // get initial slope
   slope = spxAbs(this->thesolver->fTest()[leaveIdx]);

   if(slope == 0)
   {
      // this may only happen if SoPlex decides to make an instable pivot
      assert(this->thesolver->instableLeaveNum >= 0);
      // restore original slope
      slope = spxAbs(this->thesolver->instableLeaveVal);
   }

   // set up structures for the quicksort implementation
   BreakpointCompare compare;
   compare.entry = breakpoints.get_const_ptr();

   // pointer to end of sorted part of breakpoints
   int sorted = 0;
   // minimum number of entries that are supposed to be sorted by partial sort
   int sortsize = 4;

   // get all skipable breakpoints
   for(npassedBp = 0; npassedBp < nBp && slope > 0; ++npassedBp)
   {
      // sort breakpoints only partially to save time
      if(npassedBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int i = breakpoints[npassedBp].idx;

      // compute new slope
      if(breakpoints[npassedBp].src == PVEC)
      {
         if(this->thesolver->isBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(pupd[i]);
            slope -= (this->thesolver->upper(i) * absupd) - (this->thesolver->lower(i) * absupd);

            // get most stable pivot
            if(absupd > moststable)
               moststable = absupd;
         }
      }
      else
      {
         assert(breakpoints[npassedBp].src == COPVEC);

         if(this->thesolver->isCoBasic(i))
         {
            // mark basic indices
            breakpoints[npassedBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(i);
         }
         else
         {
            R absupd = spxAbs(cupd[i]);
            slope -= (this->thesolver->rhs(i) * absupd) - (this->thesolver->lhs(i) * absupd);

            if(absupd > moststable)
               moststable = absupd;
         }
      }
   }

   --npassedBp;
   assert(npassedBp >= 0);

   // check for unboundedness/infeasibility
   if(slope > this->delta && npassedBp >= nBp - 1)
   {
      SPxOut::debug(this, "DLBFRT02 {}: unboundedness in ratio test\n",
                    this->thesolver->basis().iteration());
      flipPotential -= 0.5;
      val = max;
      return SPxFastRT<R>::selectEnter(val, leaveIdx);
   }

   SPxOut::debug(this, "DLBFRT01 {}: number of flip candidates: {}\n",
                 this->thesolver->basis().iteration(), npassedBp);

   // try to get a more stable pivot by looking at those with similar step length
   int stableBp;              // index to walk over additional breakpoints (after slope change)
   int bestBp = -1;           // breakpoints index with best possible stability
   R bestDelta = breakpoints[npassedBp].val;  // best step length (after bound flips)

   for(stableBp = npassedBp + 1; stableBp < nBp; ++stableBp)
   {
      R stableDelta = 0;

      // get next breakpoints in increasing order
      if(stableBp > sorted)
      {
         sorted = SPxQuicksortPart(breakpoints.get_ptr(), compare, sorted + 1, nBp, sortsize);
      }

      int idx = breakpoints[stableBp].idx;

      if(breakpoints[stableBp].src == PVEC)
      {
         if(this->thesolver->isBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->pVec().delta().clearIdx(idx);
            continue;
         }

         R x = pupd[idx];

         if(spxAbs(x) > moststable)
         {
            this->thesolver->pVec()[idx] = this->thesolver->vector(idx) * this->thesolver->coPvec();
            stableDelta = (x > 0.0) ? upb[idx] : lpb[idx];
            stableDelta = (stableDelta - pvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }
      else
      {
         if(this->thesolver->isCoBasic(idx))
         {
            // mark basic indices
            breakpoints[stableBp].idx = -1;
            this->thesolver->coPvec().delta().clearIdx(idx);
            continue;
         }

         R x = cupd[idx];

         if(spxAbs(x) > moststable)
         {
            stableDelta = (x > 0.0) ? ucb[idx] : lcb[idx];
            stableDelta = (stableDelta - cvec[idx]) / x;

            if(stableDelta <= bestDelta)
            {
               moststable = spxAbs(x);
               bestBp = stableBp;
            }
         }
      }

      // stop searching if the step length is too big
      if(stableDelta > this->delta + bestDelta)
         break;
   }

   degeneps = this->fastDelta / moststable;  /* as in SPxFastRT */
   // get stability requirements
   instable = this->thesolver->instableLeave;
   assert(!instable || this->thesolver->instableLeaveNum >= 0);
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   stab = instable ? lowstab : SPxFastRT<R>::minStability(moststable);

   bool foundStable = false;

   if(bestBp >= 0)
   {
      // found a more stable pivot
      if(moststable > stab)
      {
         // stability requirements are satisfied
         int idx = breakpoints[bestBp].idx;
         assert(idx >= 0);

         if(breakpoints[bestBp].src == PVEC)
            foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
         else
            foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
      }
   }

   else
   {
      // scan passed breakpoints from back to front and stop as soon as a good one is found
      while(!foundStable && npassedBp >= 0)
      {
         int idx = breakpoints[npassedBp].idx;

         // only look for non-basic variables
         if(idx >= 0)
         {
            if(breakpoints[npassedBp].src == PVEC)
               foundStable = getData(val, enterId, idx, stab, degeneps, pupd, pvec, lpb, upb, PVEC, max);
            else
               foundStable = getData(val, enterId, idx, stab, degeneps, cupd, cvec, lcb, ucb, COPVEC, max);
         }

         --npassedBp;
      }

      ++npassedBp;
   }

   if(!foundStable)
   {
      assert(!enterId.isValid());

      if(relax_count < SOPLEX_MAX_RELAX_COUNT)
      {
         SPxOut::debug(this, "DLBFRT04 {}: no valid enterId found - relaxing...\n",
                       this->thesolver->basis().iteration());
         this->relax();
         ++relax_count;
         // restore original value
         val = max;
         // try again with relaxed delta
         return SPxBoundFlippingRT<R>::selectEnter(val, leaveIdx);
      }
      else
      {
         SPxOut::debug(this, "DLBFRT05 {}: no valid enterId found - breaking...\n",
                       this->thesolver->basis().iteration());
         return enterId;
      }
   }
   else
   {
      relax_count = 0;
      this->tighten();
   }

   // flip bounds of skipped breakpoints only if a nondegenerate step is to be performed
   if(npassedBp > 0 && spxAbs(breakpoints[npassedBp].val) > this->fastDelta)
   {
      flipAndUpdate(npassedBp);
      this->thesolver->boundflips = npassedBp;

      if(npassedBp >= 10)
         flipPotential = 1;
      else
         flipPotential -= 0.05;
   }
   else
   {
      this->thesolver->boundflips = 0;
      flipPotential -= 0.1;
   }

   SPxOut::debug(this, "DLBFRT06 {}: selected Id: {} number of candidates: {}\n",
                 this->thesolver->basis().iteration(), enterId, nBp);
   return enterId;
}